

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accessors.h
# Opt level: O0

upb_MessageValue
upb_Message_GetField(upb_Message *msg,upb_MiniTableField *field,upb_MessageValue default_val)

{
  undefined8 to;
  upb_MiniTableField *f;
  _Bool _Var1;
  void *from;
  upb_MiniTableField *field_local;
  upb_Message *msg_local;
  upb_MessageValue default_val_local;
  upb_MessageValue ret;
  upb_Message **local_20;
  upb_MiniTableField *local_18;
  upb_Message *local_10;
  
  default_val_local.int64_val = default_val.str_val.size;
  msg_local = default_val.msg_val;
  _Var1 = upb_MiniTableField_IsExtension(field);
  if (_Var1) {
    _upb_Message_GetExtensionField
              (msg,(upb_MiniTableExtension *)field,&msg_local,&default_val_local.str_val.size);
  }
  else {
    local_20 = &msg_local;
    ret.str_val.size = (long)&default_val_local + 8;
    local_18 = field;
    local_10 = msg;
    _Var1 = upb_MiniTableField_IsExtension(field);
    if (_Var1) {
      __assert_fail("!upb_MiniTableField_IsExtension(field)",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                    ,0x10d,
                    "void _upb_Message_GetNonExtensionField(const struct upb_Message *, const upb_MiniTableField *, const void *, void *)"
                   );
    }
    _Var1 = upb_MiniTableField_IsInOneof(local_18);
    if (((!_Var1) &&
        (_Var1 = _upb_MiniTableField_DataIsZero_dont_copy_me__upb_internal_use_only
                           (local_18,local_20), _Var1)) ||
       (_Var1 = upb_Message_HasBaseField(local_10,local_18), _Var1)) {
      f = local_18;
      to = ret.str_val.size;
      from = _upb_Message_DataPtr_dont_copy_me__upb_internal_use_only(local_10,local_18);
      _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only(f,(void *)to,from);
    }
    else {
      _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only
                (local_18,(void *)ret.str_val.size,local_20);
    }
  }
  return stack0xffffffffffffffc8;
}

Assistant:

UPB_API_INLINE upb_MessageValue upb_Message_GetField(
    const struct upb_Message* msg, const upb_MiniTableField* field,
    upb_MessageValue default_val) {
  upb_MessageValue ret;
  if (upb_MiniTableField_IsExtension(field)) {
    _upb_Message_GetExtensionField(msg, (upb_MiniTableExtension*)field,
                                   &default_val, &ret);
  } else {
    _upb_Message_GetNonExtensionField(msg, field, &default_val, &ret);
  }
  return ret;
}